

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode inflate_stream(Curl_easy *data,contenc_writer *writer,zlibInitState started)

{
  contenc_writer **z;
  contenc_writer *zlib_init;
  int iVar1;
  contenc_writer *pcVar2;
  uint uVar3;
  CURLcode CVar4;
  int iVar5;
  content_encoding *pcVar6;
  
  z = &writer[1].downstream;
  zlib_init = writer + 1;
  if ((*(uint *)&writer[1].handler < 7) &&
     ((0x66U >> (*(uint *)&writer[1].handler & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)&writer[2].handler;
    pcVar2 = writer[1].downstream;
    pcVar6 = (content_encoding *)(*Curl_cmalloc)(0x4000);
    if (pcVar6 != (content_encoding *)0x0) {
switchD_005b6afb_caseD_0:
      writer[3].handler = pcVar6;
      *(undefined4 *)&writer[3].downstream = 0x4000;
      uVar3 = cm_zlib_inflate((z_streamp)z,5);
      iVar5 = *(int *)&writer[3].downstream;
      if (uVar3 < 2 && iVar5 != 0x4000) {
        *(zlibInitState *)&writer[1].handler = started;
        CVar4 = (*writer->downstream->handler->unencode_write)
                          (data,writer->downstream,(char *)pcVar6,(long)iVar5 * 0xffffffff + 0x4000)
        ;
        if (CVar4 != CURLE_OK) {
          exit_zlib(data,(z_stream *)z,(zlibInitState *)zlib_init,CVar4);
          goto LAB_005b6bef;
        }
      }
      switch(uVar3) {
      case 0:
        goto switchD_005b6afb_caseD_0;
      case 1:
        CVar4 = process_trailer(data,(zlib_writer *)writer);
        goto LAB_005b6bef;
      case 0xfffffffb:
        CVar4 = CURLE_OK;
LAB_005b6bef:
        (*Curl_cfree)(pcVar6);
        if ((iVar1 != 0) && (*(int *)&zlib_init->handler == 1)) {
          *(zlibInitState *)&zlib_init->handler = started;
        }
        return CVar4;
      case 0xfffffffd:
        if (*(int *)&zlib_init->handler == 1) {
          cm_zlib_inflateEnd((z_streamp)z);
          iVar5 = cm_zlib_inflateInit2_((z_streamp)z,-0xf,"1.2.12",0x70);
          if (iVar5 == 0) {
            writer[1].downstream = pcVar2;
            *(int *)&writer[2].handler = iVar1;
            writer[1].handler = (content_encoding *)0x400000002;
            goto switchD_005b6afb_caseD_0;
          }
          *(undefined4 *)&zlib_init->handler = 0;
        }
      default:
        process_zlib_error(data,(z_stream *)writer[4].downstream);
        CVar4 = exit_zlib(data,(z_stream *)z,(zlibInitState *)zlib_init,CURLE_BAD_CONTENT_ENCODING);
        goto LAB_005b6bef;
      }
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar4 = CURLE_WRITE_ERROR;
  }
  CVar4 = exit_zlib(data,(z_stream *)z,(zlibInitState *)zlib_init,CVar4);
  return CVar4;
}

Assistant:

static CURLcode inflate_stream(struct Curl_easy *data,
                               struct contenc_writer *writer,
                               zlibInitState started)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(!decomp)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via downstream_write function. */
  while(!done) {
    int status;                   /* zlib status */
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

#ifdef Z_BLOCK
    /* Z_BLOCK is only available in zlib ver. >= 1.2.0.5 */
    status = inflate(z, Z_BLOCK);
#else
    /* fallback for zlib ver. < 1.2.0.5 */
    status = inflate(z, Z_SYNC_FLUSH);
#endif

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_unencode_write(data, writer->downstream, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(data, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(data, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* don't care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          zp->trailerlen = 4; /* Tolerate up to 4 unknown trailer bytes. */
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    default:
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    }
  }
  free(decomp);

  /* We're about to leave this call so the `nread' data bytes won't be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}